

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFS.h
# Opt level: O2

void __thiscall UFS::UFS(UFS *this,int N)

{
  this->N = N;
  std::make_unique<int[]>((size_t)&this->fa);
  reset(this);
  return;
}

Assistant:

UFS(int N) : N(N), fa(std::make_unique<int[]>(N))
	{ reset(); }